

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

vector<pbrt::Vector2<float>,_std::allocator<pbrt::Vector2<float>_>_> * __thiscall
pbrt::ParameterDictionary::
lookupArray<pbrt::Vector2<float>,pstd::vector<double,pstd::pmr::polymorphic_allocator<double>>const&(*)(pbrt::ParsedParameter_const&),pbrt::Vector2<float>(*)(double_const*,pbrt::FileLoc_const*)>
          (vector<pbrt::Vector2<float>,_std::allocator<pbrt::Vector2<float>_>_>
           *__return_storage_ptr__,ParameterDictionary *this,string *name,ParameterType type,
          char *typeName,int nPerItem,
          _func_vector<double,_pstd::pmr::polymorphic_allocator<double>_>_ptr_ParsedParameter_ptr
          *getValues,_func_Vector2<float>_double_ptr_FileLoc_ptr *convert)

{
  string *__lhs;
  Vector2<float> VVar1;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar2;
  size_t sVar3;
  ParsedParameter *__lhs_00;
  ulong uVar4;
  __type _Var5;
  bool bVar6;
  vector<double,_pstd::pmr::polymorphic_allocator<double>_> *pvVar7;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  undefined1 auVar12 [64];
  allocator_type local_49;
  vector<pbrt::Vector2<float>,_std::allocator<pbrt::Vector2<float>_>_> *local_48;
  int local_40;
  int local_3c;
  char *local_38;
  undefined1 extraout_var [56];
  
  paVar2 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar3 = (this->params).nStored;
  paVar8 = &(this->params).field_2;
  if (paVar2 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar8 = paVar2;
  }
  lVar11 = 0;
  local_48 = __return_storage_ptr__;
  local_40 = nPerItem;
  local_38 = typeName;
  while( true ) {
    if (sVar3 << 3 == lVar11) {
      (local_48->super__Vector_base<pbrt::Vector2<float>,_std::allocator<pbrt::Vector2<float>_>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (local_48->super__Vector_base<pbrt::Vector2<float>,_std::allocator<pbrt::Vector2<float>_>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (local_48->super__Vector_base<pbrt::Vector2<float>,_std::allocator<pbrt::Vector2<float>_>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      return local_48;
    }
    __lhs_00 = *(ParsedParameter **)((long)paVar8 + lVar11);
    __lhs = &__lhs_00->name;
    _Var5 = std::operator==(__lhs,name);
    if ((_Var5) && (bVar6 = std::operator==(&__lhs_00->type,local_38), bVar6)) break;
    lVar11 = lVar11 + 8;
  }
  pvVar7 = (*getValues)(__lhs_00);
  local_3c = local_40;
  uVar4 = pvVar7->nStored;
  if (uVar4 != 0) {
    uVar9 = (ulong)local_40;
    if (uVar4 % uVar9 == 0) {
      __lhs_00->lookedUp = true;
      std::vector<pbrt::Vector2<float>,_std::allocator<pbrt::Vector2<float>_>_>::vector
                (local_48,uVar4 / uVar9,&local_49);
      lVar11 = 0;
      for (uVar10 = 0; uVar10 < uVar4 / uVar9; uVar10 = uVar10 + 1) {
        auVar12._0_8_ = (*convert)((double *)((long)pvVar7->ptr + lVar11),&__lhs_00->loc);
        auVar12._8_56_ = extraout_var;
        lVar11 = lVar11 + uVar9 * 8;
        VVar1.super_Tuple2<pbrt::Vector2,_float> =
             (Tuple2<pbrt::Vector2,_float>)vmovlps_avx(auVar12._0_16_);
        (local_48->super__Vector_base<pbrt::Vector2<float>,_std::allocator<pbrt::Vector2<float>_>_>)
        ._M_impl.super__Vector_impl_data._M_start[uVar10].super_Tuple2<pbrt::Vector2,_float> =
             VVar1.super_Tuple2<pbrt::Vector2,_float>;
      }
      return local_48;
    }
    ErrorExit<std::__cxx11::string_const&,int&>
              (&__lhs_00->loc,"Number of values provided for \"%s\" not a multiple of %d",__lhs,
               &local_3c);
  }
  ErrorExit<std::__cxx11::string_const&>(&__lhs_00->loc,"No values provided for \"%s\".",__lhs);
}

Assistant:

std::vector<ReturnType> ParameterDictionary::lookupArray(const std::string &name,
                                                         ParameterType type,
                                                         const char *typeName,
                                                         int nPerItem, G getValues,
                                                         C convert) const {
    for (const ParsedParameter *p : params)
        if (p->name == name && p->type == typeName)
            return returnArray<ReturnType>(getValues(*p), *p, nPerItem, convert);

    return {};
}